

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::unfoldedBlockinstr<wasm::WATParser::ParseModuleTypesCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations)

{
  MaybeResult<wasm::Ok> *i;
  
  block<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false);
  if (*(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) == '\x01') {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                      __return_storage_ptr__);
    ifelse<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false);
    if (*(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) == '\x01') {
      std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                        __return_storage_ptr__);
      loop<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false);
      if (*(__index_type *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) == '\x01')
      {
        std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
        ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                          __return_storage_ptr__);
        trycatch<wasm::WATParser::ParseModuleTypesCtx>(__return_storage_ptr__,ctx,annotations,false)
        ;
        if (*(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) == '\x01'
           ) {
          std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
          ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                            __return_storage_ptr__);
          trytable<wasm::WATParser::ParseModuleTypesCtx>
                    (__return_storage_ptr__,ctx,annotations,false);
          if (*(__index_type *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) ==
              '\x01') {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::None,_wasm::Err> *)
                              __return_storage_ptr__);
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<> unfoldedBlockinstr(Ctx& ctx,
                                 const std::vector<Annotation>& annotations) {
  ctx.setSrcLoc(annotations);
  if (auto i = block(ctx, annotations, false)) {
    return i;
  }
  if (auto i = ifelse(ctx, annotations, false)) {
    return i;
  }
  if (auto i = loop(ctx, annotations, false)) {
    return i;
  }
  if (auto i = trycatch(ctx, annotations, false)) {
    return i;
  }
  if (auto i = trytable(ctx, annotations, false)) {
    return i;
  }
  return {};
}